

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O1

Vec_Int_t * Gia_RsbCiWindow(Gia_Man_t *p,int nPis)

{
  Vec_Int_t *pVVar1;
  void *__ptr;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *vMap;
  Vec_Wec_t *vLevels;
  Vec_Int_t *pVVar5;
  int iVar6;
  long lVar7;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  iVar6 = p->nObjs;
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar3 = iVar6;
  }
  vMap->nSize = 0;
  vMap->nCap = iVar3;
  if (iVar3 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar3 << 2);
  }
  vMap->pArray = piVar4;
  vMap->nSize = iVar6;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0xff,(long)iVar6 << 2);
  }
  uVar2 = Gia_ManLevelNum(p);
  vLevels = (Vec_Wec_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < uVar2) {
    iVar6 = uVar2 + 1;
  }
  vLevels->nSize = 0;
  vLevels->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar6,0x10);
  }
  vLevels->pArray = pVVar5;
  vLevels->nSize = uVar2 + 1;
  Gia_ManStaticFanoutStart(p);
  Gia_ManIncrementTravId(p);
  uVar2 = Gia_WinAddCiWithMaxFanouts(p);
  if ((int)uVar2 < p->nTravIdsAlloc) {
    p->pTravIds[uVar2] = p->nTravIds;
    Vec_IntPush(p_00,uVar2);
    if (1 < nPis) {
      iVar6 = nPis + -1;
      do {
        iVar3 = Gia_WinAddCiWithMaxDivisors(p,vLevels);
        Gia_WinTryAddingNode(p,iVar3,-1,vLevels,p_00);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    qsort(p_00->pArray,(long)p_00->nSize,4,Vec_IntSortCompare1);
    pVVar5 = Gia_RsbCiTranslate(p,p_00,vMap);
    Gia_ManStaticFanoutStop(p);
    iVar6 = vLevels->nCap;
    if (0 < (long)iVar6) {
      pVVar1 = vLevels->pArray;
      lVar7 = 0;
      do {
        __ptr = *(void **)((long)&pVVar1->pArray + lVar7);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)&pVVar1->pArray + lVar7) = 0;
        }
        lVar7 = lVar7 + 0x10;
      } while ((long)iVar6 * 0x10 != lVar7);
    }
    if (vLevels->pArray != (Vec_Int_t *)0x0) {
      free(vLevels->pArray);
      vLevels->pArray = (Vec_Int_t *)0x0;
    }
    vLevels->nCap = 0;
    vLevels->nSize = 0;
    free(vLevels);
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      vMap->pArray = (int *)0x0;
    }
    free(vMap);
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    return pVVar5;
  }
  __assert_fail("Id < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
}

Assistant:

Vec_Int_t * Gia_RsbCiWindow( Gia_Man_t * p, int nPis )
{
    Vec_Int_t * vRes;  int i, iMaxFan;
    Vec_Int_t * vNodes  = Vec_IntAlloc( 100 );
    Vec_Int_t * vMap    = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Wec_t * vLevels = Vec_WecStart( Gia_ManLevelNum(p)+1 );
    Gia_ManStaticFanoutStart( p );
    Gia_ManIncrementTravId(p);
    // add the first one
    iMaxFan = Gia_WinAddCiWithMaxFanouts( p );
    Gia_ObjSetTravIdCurrentId( p, iMaxFan );
    Vec_IntPush( vNodes, iMaxFan );
    // add remaining ones
    for ( i = 1; i < nPis; i++ )
    {
        iMaxFan = Gia_WinAddCiWithMaxDivisors( p, vLevels );
        Gia_WinTryAddingNode( p, iMaxFan, -1, vLevels, vNodes );
    }
    Vec_IntSort( vNodes, 0 );
    vRes = Gia_RsbCiTranslate( p, vNodes, vMap );
    Gia_ManStaticFanoutStop( p );
    Vec_WecFree( vLevels );
    Vec_IntFree( vMap );
//Vec_IntPrint( vNodes );
    Vec_IntFree( vNodes );
    return vRes;
}